

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

double __thiscall ON_SubDMatrix::TestEvaluation(ON_SubDMatrix *this)

{
  ON_SubDComponentPtr *component_ring;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ON_SubD *pOVar7;
  ON_SubDVertex *center_vertex;
  ON_SubDVertex *pOVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  char *sFormat;
  uint i_1;
  ON_3dPoint *pOVar12;
  long lVar13;
  int line_number;
  uint j;
  ulong uVar14;
  ulong uVar15;
  ON_3dPoint *p;
  uint i;
  ulong new_capacity;
  undefined4 uVar16;
  undefined4 uVar17;
  double dVar18;
  double dVar19;
  uint SP_low_precision_index;
  ON_SimpleArray<const_ON_SubDVertex_*> vertex_ring_array;
  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  double N_Scol_precision [3];
  ON_SimpleArray<ON_3dPoint> _ringP1;
  ON_SimpleArray<ON_3dPoint> _ringP0;
  double N_outer_point_precision [3];
  double N_vertex_point_precision [3];
  ON_SimpleArray<double> _Scol;
  ON_SubD subd;
  ON_SimpleArray<ON_3dPoint> _P;
  double local_250;
  uint local_22c;
  ulong local_228;
  ON_3dPoint *local_220;
  ON_3dPoint *local_218;
  undefined8 uStack_210;
  uint local_1fc;
  ON_SubDVertex **local_1f8;
  ulong local_1f0;
  long local_1e8;
  double **local_1e0;
  ON_SimpleArray<const_ON_SubDVertex_*> local_1d8;
  ON_SimpleArray<ON_SubDComponentPtr> local_1c0;
  double local_1a8 [3];
  ON_3dPoint *local_190;
  ulong local_188;
  long local_180;
  long local_178;
  ON_3dPoint *local_170;
  ON_SimpleArray<ON_3dPoint> local_168;
  ON_SimpleArray<ON_3dPoint> local_150;
  double local_138 [4];
  double local_118 [4];
  ON_SimpleArray<double> local_f8;
  ON_SubD local_e0;
  ON_SimpleArray<ON_3dPoint> local_c0;
  ON_3dPoint local_a8;
  ON_3dVector local_90;
  ON_SubDSectorIterator local_78;
  
  if (((((this->m_S == (double **)0x0) || (this->m_R < 3)) ||
       (bVar1 = ON_SubDSectorType::IsValid(&this->m_sector_type), !bVar1)) ||
      ((uVar3 = ON_SubDSectorType::FaceCount(&this->m_sector_type), uVar3 == 0 ||
       (uVar4 = ON_SubDSectorType::EdgeCount(&this->m_sector_type), uVar4 == 0)))) ||
     ((uVar5 = ON_SubDSectorType::PointRingCount(&this->m_sector_type), uVar5 == 0 ||
      ((uVar5 != this->m_R ||
       (uVar6 = ON_SubDSectorType::FacetEdgeCount(&this->m_sector_type), uVar6 == 0)))))) {
    ON_SubDIncrementErrorCount();
    uVar16 = 0x9e331dd2;
    uVar17 = 0xffe5f8bd;
    goto LAB_0060b9ad;
  }
  local_250 = TestMatrix(this);
  local_1e0 = this->m_S;
  local_22c = 0xffffffff;
  new_capacity = (ulong)uVar5;
  local_c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
  local_c0.m_a = (ON_3dPoint *)0x0;
  local_c0.m_count = 0;
  local_c0.m_capacity = 0;
  ON_SimpleArray<ON_3dPoint>::SetCapacity(&local_c0,new_capacity);
  local_220 = local_c0.m_a;
  local_f8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00818f10;
  local_f8.m_a = (double *)0x0;
  local_f8.m_count = 0;
  local_f8.m_capacity = 0;
  ON_SimpleArray<double>::SetCapacity(&local_f8,new_capacity);
  pdVar11 = local_f8.m_a;
  ON_SubD::ON_SubD(&local_e0);
  pOVar7 = ON_SubDSectorType::SectorRingSubD(&this->m_sector_type,0.0,0.0,&local_e0);
  if (&local_e0 == pOVar7) {
    center_vertex = ON_SubD::FirstVertex(&local_e0);
    if (((center_vertex == (ON_SubDVertex *)0x0) || (uVar4 != center_vertex->m_edge_count)) ||
       (uVar3 != center_vertex->m_face_count)) {
      ON_SubDIncrementErrorCount();
      goto LAB_0060c0b7;
    }
    local_78.m_current_fei[0] = 0;
    local_78.m_current_fei[1] = 0;
    local_78.m_initial_face_dir = 0;
    local_78.m_current_face_dir = 0;
    local_78.m_current_eptr[1].m_ptr = 0;
    local_78.m_initial_fvi = 0;
    local_78.m_current_fvi = 0;
    local_78.m_current_face = (ON_SubDFace *)0x0;
    local_78.m_current_eptr[0].m_ptr = 0;
    local_78.m_center_vertex = (ON_SubDVertex *)0x0;
    local_78.m_initial_face = (ON_SubDFace *)0x0;
    local_78.m_current_ring_index = 0;
    pOVar8 = ON_SubDSectorIterator::Initialize(&local_78,center_vertex);
    if (pOVar8 == (ON_SubDVertex *)0x0) {
      ON_SubDIncrementErrorCount();
      goto LAB_0060c0b7;
    }
    uVar3 = ON_SubD::VertexCount(&local_e0);
    local_1d8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00829178;
    local_1d8.m_a = (ON_SubDVertex **)0x0;
    local_1d8.m_count = 0;
    local_1d8.m_capacity = 0;
    if (uVar3 != 0) {
      ON_SimpleArray<const_ON_SubDVertex_*>::SetCapacity(&local_1d8,(ulong)uVar3);
    }
    local_1c0._vptr_ON_SimpleArray = (_func_int **)center_vertex;
    do {
      ON_SimpleArray<const_ON_SubDVertex_*>::Append(&local_1d8,(ON_SubDVertex **)&local_1c0);
      local_1c0._vptr_ON_SimpleArray = *(_func_int ***)((long)local_1c0._vptr_ON_SimpleArray + 0x58)
      ;
    } while ((ON_SubDVertex *)local_1c0._vptr_ON_SimpleArray != (ON_SubDVertex *)0x0);
    if (uVar5 == local_1d8.m_count) {
      local_1f8 = local_1d8.m_a;
      local_1c0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828990;
      local_1c0.m_a = (ON_SubDComponentPtr *)0x0;
      local_1c0.m_count = 0;
      local_1c0.m_capacity = 0;
      uVar3 = ON_SubD::GetSectorComponentRing(&local_78,&local_1c0);
      if ((uVar3 < 4) ||
         (uVar4 = ON_SubDSectorType::ComponentRingCount(&this->m_sector_type),
         component_ring = local_1c0.m_a, dVar19 = ON_DBL_QNAN, uVar3 != uVar4)) {
        ON_SubDIncrementErrorCount();
        local_250 = -1.23432101234321e+308;
      }
      else {
        local_150._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
        local_150.m_a = (ON_3dPoint *)0x0;
        local_150.m_count = 0;
        local_150.m_capacity = 0;
        local_168._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008179f8;
        local_168.m_a = (ON_3dPoint *)0x0;
        local_168.m_count = 0;
        local_168.m_capacity = 0;
        uVar15 = (ulong)(uVar5 + (uVar5 == 0));
        uVar9 = 0;
        do {
          pdVar11[uVar9] = dVar19;
          uVar9 = uVar9 + 1;
        } while (uVar15 != uVar9);
        local_1f0 = (ulong)uVar3;
        local_188 = 2;
        if (2 < uVar5) {
          local_188 = (ulong)uVar5;
        }
        local_178 = -uVar15;
        local_1e8 = 0;
        uVar9 = 0;
        do {
          local_118[0] = 0.0;
          local_118[1] = 0.0;
          local_118[2] = 0.0;
          local_138[2] = 0.0;
          local_138[0] = 0.0;
          local_138[1] = 0.0;
          local_1a8[2] = 0.0;
          local_1a8[0] = 0.0;
          local_1a8[1] = 0.0;
          local_190 = local_220 + uVar9;
          lVar13 = 0;
          local_228 = uVar9;
          while (bVar1 = ClearCachedPoints(uVar3,component_ring), bVar1) {
            local_1f8[local_228]->m_P[lVar13] = 1.0;
            uVar4 = ON_SubD::GetSectorPointRing(false,local_1f0,component_ring,&local_150);
            if (uVar5 != uVar4) break;
            local_180 = lVar13 + 1;
            uVar4 = (uint)local_180;
            if (local_180 == 3) {
              uVar4 = 0;
            }
            uVar6 = (uint)lVar13;
            local_1fc = ((uVar6 + 2) / 3) * -3 + uVar6 + 2;
            local_218 = (ON_3dPoint *)CONCAT71(local_218._1_7_,1);
            uVar9 = 1;
            local_170 = local_150.m_a;
            pOVar12 = local_150.m_a;
            do {
              dVar19 = ON_3dPoint::operator[](pOVar12,uVar4);
              if ((dVar19 != 0.0) || (NAN(dVar19))) {
LAB_0060bd63:
                ON_SubDIncrementErrorCount();
                break;
              }
              dVar19 = ON_3dPoint::operator[](pOVar12,local_1fc);
              if ((dVar19 != 0.0) || (NAN(dVar19))) goto LAB_0060bd63;
              dVar19 = ON_3dPoint::operator[](pOVar12,uVar6);
              dVar18 = 1.0;
              if (local_1e8 + uVar9 != 1) {
                dVar18 = 0.0;
              }
              if ((dVar19 != dVar18) || (NAN(dVar19) || NAN(dVar18))) goto LAB_0060bd63;
              local_218 = (ON_3dPoint *)CONCAT71(local_218._1_7_,uVar9 < new_capacity);
              pOVar12 = pOVar12 + 1;
              lVar10 = local_178 + uVar9;
              uVar9 = uVar9 + 1;
            } while (lVar10 != 0);
            if (((ulong)local_218 & 1) == 0) {
              uVar4 = ON_SubD::GetSectorSubdivisionPointRing(component_ring,local_1f0,&local_168);
              if (uVar5 == uVar4) {
                local_218 = local_168.m_a;
                uVar9 = 0;
                do {
                  pOVar12 = local_220 + uVar9;
                  pOVar12->z = ON_3dPoint::Origin.z;
                  dVar19 = ON_3dPoint::Origin.y;
                  pOVar12->x = ON_3dPoint::Origin.x;
                  pOVar12->y = dVar19;
                  uVar14 = 0;
                  p = local_170;
                  do {
                    ::operator*(&local_a8,local_1e0[uVar9][uVar14],p);
                    ON_3dVector::ON_3dVector(&local_90,&local_a8);
                    ON_3dPoint::operator+=(pOVar12,&local_90);
                    uVar14 = uVar14 + 1;
                    p = p + 1;
                  } while (uVar15 != uVar14);
                  uVar9 = uVar9 + 1;
                } while (uVar9 != uVar15);
                pdVar11 = ON_3dPoint::operator[](local_190,uVar6);
                if ((0.0 < *pdVar11) &&
                   (bVar1 = TestPoint(local_220,0,*local_218,uVar6,local_118,&local_22c), bVar1)) {
                  bVar1 = uVar5 != 1;
                  if (uVar5 != 1) {
                    uVar9 = 1;
                    pOVar12 = local_218;
                    do {
                      pOVar12 = pOVar12 + 1;
                      bVar2 = TestPoint(local_220,(uint)uVar9,*pOVar12,uVar6,local_138,&local_22c);
                      if (!bVar2) {
                        ON_SubDIncrementErrorCount();
                        break;
                      }
                      uVar9 = uVar9 + 1;
                      bVar1 = uVar9 < new_capacity;
                    } while (local_188 != uVar9);
                  }
                  if (bVar1) {
                    bVar1 = false;
                    goto LAB_0060c06a;
                  }
                  uVar9 = 0;
                  pOVar12 = local_218;
                  do {
                    local_218 = (ON_3dPoint *)local_1e0[uVar9][local_228];
                    uStack_210 = 0;
                    dVar19 = ON_3dPoint::operator[](pOVar12,uVar6);
                    dVar19 = ABS((double)local_218 - dVar19);
                    if (local_1a8[lVar13] <= dVar19 && dVar19 != local_1a8[lVar13]) {
                      local_1a8[lVar13] = dVar19;
                    }
                    uVar9 = uVar9 + 1;
                    pOVar12 = pOVar12 + 1;
                  } while (uVar15 != uVar9);
                  uVar16 = SUB84(local_118[0],0);
                  uVar17 = (undefined4)((ulong)local_118[0] >> 0x20);
                  if ((local_118[0] != local_118[lVar13]) ||
                     (NAN(local_118[0]) || NAN(local_118[lVar13]))) {
                    line_number = 0x19c;
                    sFormat = "x,y,z vertex point precisions are not identical.";
                  }
                  else if ((local_138[0] != local_138[lVar13]) ||
                          (NAN(local_138[0]) || NAN(local_138[lVar13]))) {
                    line_number = 0x1a1;
                    sFormat = "x,y,z outer point precisions are not identical.";
                  }
                  else {
                    if ((local_1a8[0] == local_1a8[lVar13]) &&
                       (!NAN(local_1a8[0]) && !NAN(local_1a8[lVar13]))) {
                      if (local_118[0] <= local_250) {
                        uVar16 = SUB84(local_250,0);
                        uVar17 = (undefined4)((ulong)local_250 >> 0x20);
                      }
                      dVar19 = local_138[0];
                      if (local_138[0] <= (double)CONCAT44(uVar17,uVar16)) {
                        dVar19 = (double)CONCAT44(uVar17,uVar16);
                      }
                      local_250 = local_1a8[0];
                      if (local_1a8[0] <= dVar19) {
                        local_250 = dVar19;
                      }
                      local_1f8[local_228]->m_P[lVar13] = 0.0;
                      bVar1 = true;
                      goto LAB_0060c06a;
                    }
                    line_number = 0x1a6;
                    sFormat = "x,y,z S column precisions are not identical.";
                  }
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
                             ,line_number,"",sFormat);
                }
                ON_SubDIncrementErrorCount();
                goto LAB_0060c063;
              }
              ON_SubDIncrementErrorCount();
              bVar1 = false;
            }
            else {
LAB_0060c063:
              bVar1 = false;
            }
LAB_0060c06a:
            if ((local_180 == 3) || (lVar13 = local_180, !bVar1)) goto LAB_0060c08c;
          }
          ON_SubDIncrementErrorCount();
          bVar1 = false;
LAB_0060c08c:
          if (!bVar1) {
            local_250 = -1.23432101234321e+308;
            break;
          }
          uVar9 = local_228 + 1;
          local_1e8 = local_1e8 + -1;
        } while (uVar9 != uVar15);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_168);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_150);
      }
      ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&local_1c0);
    }
    else {
      ON_SubDIncrementErrorCount();
      local_250 = -1.23432101234321e+308;
    }
    ON_SimpleArray<const_ON_SubDVertex_*>::~ON_SimpleArray(&local_1d8);
  }
  else {
    ON_SubDIncrementErrorCount();
LAB_0060c0b7:
    local_250 = -1.23432101234321e+308;
  }
  ON_SubD::~ON_SubD(&local_e0);
  ON_SimpleArray<double>::~ON_SimpleArray(&local_f8);
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_c0);
  uVar16 = SUB84(local_250,0);
  uVar17 = (undefined4)((ulong)local_250 >> 0x20);
LAB_0060b9ad:
  return (double)CONCAT44(uVar17,uVar16);
}

Assistant:

double ON_SubDMatrix::TestEvaluation() const
{
  if ( nullptr == m_S || m_R < 3 )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  if (!m_sector_type.IsValid())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int F = m_sector_type.FaceCount();
  if (0 == F)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int N = m_sector_type.EdgeCount();
  if (0 == N)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  const unsigned int R = m_sector_type.PointRingCount();
  if (0 == R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (R != m_R)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  const unsigned f_edge_count = m_sector_type.FacetEdgeCount();
  if (0 == f_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  double rc = TestMatrix();
  const double*const* S = m_S;
  
  unsigned int SP_low_precision_index = ON_UNSET_UINT_INDEX;
  
  ON_SimpleArray< ON_3dPoint > _P(R);
  ON_3dPoint* SP = _P.Array();

  ON_SimpleArray< double > _Scol(R);
  double* Scol = _Scol.Array();

  ON_SubD subd;
  if (&subd != m_sector_type.SectorRingSubD(0.0,0.0,&subd))
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex* vertex0 = subd.FirstVertex();
  if (nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (N != vertex0->m_edge_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  if (F != vertex0->m_face_count)
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  
  ON_SubDSectorIterator sit;
  if ( nullptr == sit.Initialize(vertex0) )
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

  ON_SimpleArray<const ON_SubDVertex*> vertex_ring_array(subd.VertexCount());
  for (const ON_SubDVertex* vertex = vertex0; nullptr != vertex; vertex = vertex->m_next_vertex)
  {
    vertex_ring_array.Append(vertex);
  }
  if ( R != vertex_ring_array.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDVertex*const* vertex_ring = vertex_ring_array.Array();

  ON_SimpleArray<ON_SubDComponentPtr> component_ring_array;
  const unsigned int component_ring_count = ON_SubD::GetSectorComponentRing(sit,component_ring_array);
  if ( component_ring_count < 4 || component_ring_count != m_sector_type.ComponentRingCount())
    return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
  const ON_SubDComponentPtr* component_ring = component_ring_array.Array();

  ON_SimpleArray< ON_3dPoint > _ringP0;

  ON_SimpleArray< ON_3dPoint > _ringP1;

  for (unsigned int vi = 0; vi < R; vi++)
    Scol[vi] = ON_DBL_QNAN;

  for (unsigned int vi = 0; vi < R; vi++)
  {
    double N_vertex_point_precision[3] = { 0 };
    double N_outer_point_precision[3] = { 0 };
    double N_Scol_precision[3] = { 0 };

    for (unsigned int Pi = 0; Pi < 3; Pi++)
    {
      if (false == ClearCachedPoints(component_ring_count,component_ring))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 1.0;

      if ( R != ON_SubD::GetSectorPointRing(false,component_ring_count,component_ring,_ringP0))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP0 = _ringP0.Array();

      // vertex_ring[]->m_P and ringP0[] should be same point lists
      for (unsigned int i = 0; i < R; i++)
      {
        if (0.0 == ringP0[i][(Pi+1)%3] && 0.0 == ringP0[i][(Pi+2)%3])
        {
          if ( ringP0[i][Pi] == ((i == vi) ? 1.0 : 0.0) )
            continue;
        }
        // vertex_ring[] is not in the expected order or
        // there is a bug in ON_SubD::GetSectorPointRing
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if ( R != ON_SubD::GetSectorSubdivisionPointRing(component_ring, component_ring_count,_ringP1))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      const ON_3dPoint* ringP1 = _ringP1.Array();

      for (unsigned int i = 0; i < R; i++)
      {
        SP[i] = ON_3dPoint::Origin;
        for (unsigned int j = 0; j < R; j++)
        {
          SP[i] += S[i][j] * ringP0[j];
        }
      }

      if (!(SP[vi][Pi] > 0.0))
      {
        // ON_ERROR("SP[vi][Pi] is not positive.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (false == TestPoint(SP, 0, ringP1[0], Pi, N_vertex_point_precision, &SP_low_precision_index))
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);

      for (unsigned int j = 1; j < R; j++)
      {
        if (false == TestPoint(SP, j, ringP1[j], Pi, N_outer_point_precision, &SP_low_precision_index))
          return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      for (unsigned int i = 0; i < R; i++)
      {
        double d = fabs(S[i][vi] - ringP1[i][Pi]);
        if (d > N_Scol_precision[Pi])
          N_Scol_precision[Pi] = d;
      }

      if (!(N_vertex_point_precision[0] == N_vertex_point_precision[Pi]))
      {
        ON_ERROR("x,y,z vertex point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_outer_point_precision[0] == N_outer_point_precision[Pi]))
      {
        ON_ERROR("x,y,z outer point precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }
      if (!(N_Scol_precision[0] == N_Scol_precision[Pi]))
      {
        ON_ERROR("x,y,z S column precisions are not identical.");
        return ON_SUBD_RETURN_ERROR(ON_UNSET_VALUE);
      }

      if (rc < N_vertex_point_precision[0])
        rc = N_vertex_point_precision[0];
      if (rc < N_outer_point_precision[0])
        rc = N_outer_point_precision[0];
      if (rc < N_Scol_precision[0])
        rc = N_Scol_precision[0];

      const_cast<ON_SubDVertex*>(vertex_ring[vi])->m_P[Pi] = 0.0;
    }
  }

  return rc; // basic tests passed.
}